

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# state.h
# Opt level: O0

void __thiscall jsonnet::internal::anon_unknown_0::Heap::markFrom(Heap *this,HeapEntity *from)

{
  long lVar1;
  bool bVar2;
  size_type sVar3;
  reference ppVar4;
  reference ppVar5;
  reference ppHVar6;
  long in_RSI;
  long in_RDI;
  HeapEntity *next;
  pair<const_jsonnet::internal::Identifier_*const,_jsonnet::internal::(anonymous_namespace)::HeapThunk_*>
  upv_4;
  iterator __end7;
  iterator __begin7;
  BindingFrame *__range7;
  HeapThunk *thunk;
  pair<const_jsonnet::internal::Identifier_*const,_jsonnet::internal::(anonymous_namespace)::HeapThunk_*>
  upv_3;
  const_iterator __end6_4;
  const_iterator __begin6_4;
  BindingFrame *__range6_4;
  HeapClosure *func;
  HeapThunk *el;
  iterator __end6_3;
  iterator __begin6_3;
  vector<jsonnet::internal::(anonymous_namespace)::HeapThunk_*,_std::allocator<jsonnet::internal::(anonymous_namespace)::HeapThunk_*>_>
  *__range6_3;
  HeapArray *arr;
  pair<const_jsonnet::internal::Identifier_*const,_jsonnet::internal::(anonymous_namespace)::HeapThunk_*>
  upv_2;
  iterator __end6_2;
  iterator __begin6_2;
  map<const_jsonnet::internal::Identifier_*,_jsonnet::internal::(anonymous_namespace)::HeapThunk_*,_std::less<const_jsonnet::internal::Identifier_*>,_std::allocator<std::pair<const_jsonnet::internal::Identifier_*const,_jsonnet::internal::(anonymous_namespace)::HeapThunk_*>_>_>
  *__range6_2;
  pair<const_jsonnet::internal::Identifier_*const,_jsonnet::internal::(anonymous_namespace)::HeapThunk_*>
  upv_1;
  const_iterator __end6_1;
  const_iterator __begin6_1;
  BindingFrame *__range6_1;
  HeapComprehensionObject *obj_2;
  HeapExtendedObject *obj_1;
  pair<const_jsonnet::internal::Identifier_*const,_jsonnet::internal::(anonymous_namespace)::HeapThunk_*>
  upv;
  const_iterator __end6;
  const_iterator __begin6;
  BindingFrame *__range6;
  HeapSimpleObject *obj;
  HeapEntity *curr;
  State *s;
  size_t curr_index;
  vector<State,_std::allocator<State>_> stack;
  GarbageCollectionMark thisMark;
  HeapEntity *in_stack_fffffffffffffdd8;
  Heap *in_stack_fffffffffffffde0;
  HeapEntity **in_stack_fffffffffffffde8;
  HeapEntity *in_stack_fffffffffffffdf0;
  HeapEntity *pHVar7;
  long local_208;
  long local_1f8;
  long local_1e8;
  long local_1d8;
  long local_1c8;
  long local_1b8;
  _Self local_178;
  _Self local_170;
  GarbageCollectionMark *local_168;
  HeapEntity *local_160;
  Identifier *local_158;
  HeapThunk *pHStack_150;
  _Self local_140;
  _Self local_138;
  HeapEntity *local_130;
  HeapEntity *local_128;
  HeapThunk *local_120;
  HeapThunk **local_118;
  __normal_iterator<jsonnet::internal::(anonymous_namespace)::HeapThunk_**,_std::vector<jsonnet::internal::(anonymous_namespace)::HeapThunk_*,_std::allocator<jsonnet::internal::(anonymous_namespace)::HeapThunk_*>_>_>
  local_110;
  HeapEntity *local_108;
  HeapEntity *local_100;
  Identifier *local_f8;
  HeapThunk *pHStack_f0;
  _Self local_e0;
  _Self local_d8;
  HeapEntity *local_d0;
  Identifier *local_c8;
  HeapThunk *pHStack_c0;
  _Self local_b0;
  _Self local_a8;
  HeapEntity *local_a0;
  HeapEntity *local_98;
  HeapEntity *local_90;
  Identifier *local_88;
  HeapThunk *pHStack_80;
  _Self local_78;
  _Self local_70;
  HeapEntity *local_68;
  HeapEntity *local_60;
  HeapEntity *local_58;
  reference local_50;
  size_type local_48;
  vector<State,_std::allocator<State>_> local_30;
  GarbageCollectionMark local_11;
  
  if (in_RSI == 0) {
    __assert_fail("from != nullptr",
                  "/workspace/llm4binary/github/license_c_cmakelists/google[P]jsonnet/core/state.h",
                  0x160,
                  "void jsonnet::internal::(anonymous namespace)::Heap::markFrom(HeapEntity *)");
  }
  local_11 = *(char *)(in_RDI + 0x10) + '\x01';
  std::vector<State,_std::allocator<State>_>::vector
            ((vector<State,_std::allocator<State>_> *)0x233e6c);
  std::
  vector<jsonnet::internal::(anonymous_namespace)::Heap::markFrom(jsonnet::internal::(anonymous_namespace)::HeapEntity*)::State,std::allocator<jsonnet::internal::(anonymous_namespace)::Heap::markFrom(jsonnet::internal::(anonymous_namespace)::HeapEntity*)::State>>
  ::emplace_back<jsonnet::internal::(anonymous_namespace)::HeapEntity*&>
            ((vector<State,_std::allocator<State>_> *)in_stack_fffffffffffffdf0,
             in_stack_fffffffffffffde8);
  do {
    sVar3 = std::vector<State,_std::allocator<State>_>::size(&local_30);
    if (sVar3 == 0) {
      std::vector<State,_std::allocator<State>_>::~vector
                ((vector<State,_std::allocator<State>_> *)in_stack_fffffffffffffdf0);
      return;
    }
    local_48 = std::vector<State,_std::allocator<State>_>::size(&local_30);
    local_48 = local_48 - 1;
    local_50 = std::vector<State,_std::allocator<State>_>::operator[](&local_30,local_48);
    pHVar7 = local_50->ent;
    local_58 = pHVar7;
    if (pHVar7->mark != local_11) {
      pHVar7->mark = local_11;
      switch(pHVar7->type) {
      case THUNK:
        if (pHVar7 == (HeapEntity *)0x0) {
          local_208 = 0;
        }
        else {
          local_208 = __dynamic_cast(pHVar7,&(anonymous_namespace)::HeapEntity::typeinfo,
                                     &(anonymous_namespace)::HeapThunk::typeinfo,0);
        }
        if (local_208 == 0) {
          __assert_fail("dynamic_cast<HeapThunk *>(curr)",
                        "/workspace/llm4binary/github/license_c_cmakelists/google[P]jsonnet/core/state.h"
                        ,0x19b,
                        "void jsonnet::internal::(anonymous namespace)::Heap::markFrom(HeapEntity *)"
                       );
        }
        local_160 = local_58;
        if ((local_58->field_0xa & 1) == 0) {
          local_168 = &local_58[2].mark;
          local_170._M_node =
               (_Base_ptr)
               std::
               map<const_jsonnet::internal::Identifier_*,_jsonnet::internal::(anonymous_namespace)::HeapThunk_*,_std::less<const_jsonnet::internal::Identifier_*>,_std::allocator<std::pair<const_jsonnet::internal::Identifier_*const,_jsonnet::internal::(anonymous_namespace)::HeapThunk_*>_>_>
               ::begin((map<const_jsonnet::internal::Identifier_*,_jsonnet::internal::(anonymous_namespace)::HeapThunk_*,_std::less<const_jsonnet::internal::Identifier_*>,_std::allocator<std::pair<const_jsonnet::internal::Identifier_*const,_jsonnet::internal::(anonymous_namespace)::HeapThunk_*>_>_>
                        *)in_stack_fffffffffffffdd8);
          local_178._M_node =
               (_Base_ptr)
               std::
               map<const_jsonnet::internal::Identifier_*,_jsonnet::internal::(anonymous_namespace)::HeapThunk_*,_std::less<const_jsonnet::internal::Identifier_*>,_std::allocator<std::pair<const_jsonnet::internal::Identifier_*const,_jsonnet::internal::(anonymous_namespace)::HeapThunk_*>_>_>
               ::end((map<const_jsonnet::internal::Identifier_*,_jsonnet::internal::(anonymous_namespace)::HeapThunk_*,_std::less<const_jsonnet::internal::Identifier_*>,_std::allocator<std::pair<const_jsonnet::internal::Identifier_*const,_jsonnet::internal::(anonymous_namespace)::HeapThunk_*>_>_>
                      *)in_stack_fffffffffffffdd8);
          while (bVar2 = std::operator!=(&local_170,&local_178), bVar2) {
            std::
            _Rb_tree_iterator<std::pair<const_jsonnet::internal::Identifier_*const,_jsonnet::internal::(anonymous_namespace)::HeapThunk_*>_>
            ::operator*((_Rb_tree_iterator<std::pair<const_jsonnet::internal::Identifier_*const,_jsonnet::internal::(anonymous_namespace)::HeapThunk_*>_>
                         *)0x2346e2);
            addIfHeapEntity(in_stack_fffffffffffffde0,in_stack_fffffffffffffdd8,
                            (vector<jsonnet::internal::(anonymous_namespace)::HeapEntity_*,_std::allocator<jsonnet::internal::(anonymous_namespace)::HeapEntity_*>_>
                             *)0x23470e);
            std::
            _Rb_tree_iterator<std::pair<const_jsonnet::internal::Identifier_*const,_jsonnet::internal::(anonymous_namespace)::HeapThunk_*>_>
            ::operator++((_Rb_tree_iterator<std::pair<const_jsonnet::internal::Identifier_*const,_jsonnet::internal::(anonymous_namespace)::HeapThunk_*>_>
                          *)in_stack_fffffffffffffde0);
          }
          lVar1._0_1_ = local_160[5].mark;
          lVar1._1_1_ = local_160[5].type;
          lVar1._2_6_ = *(undefined6 *)&local_160[5].field_0xa;
          if (lVar1 != 0) {
            addIfHeapEntity(in_stack_fffffffffffffde0,in_stack_fffffffffffffdd8,
                            (vector<jsonnet::internal::(anonymous_namespace)::HeapEntity_*,_std::allocator<jsonnet::internal::(anonymous_namespace)::HeapEntity_*>_>
                             *)0x234755);
          }
        }
        else {
          bVar2 = Value::isHeap((Value *)(local_58 + 1));
          if (bVar2) {
            addIfHeapEntity(in_stack_fffffffffffffde0,in_stack_fffffffffffffdd8,
                            (vector<jsonnet::internal::(anonymous_namespace)::HeapEntity_*,_std::allocator<jsonnet::internal::(anonymous_namespace)::HeapEntity_*>_>
                             *)0x234673);
          }
        }
        break;
      case ARRAY:
        if (pHVar7 == (HeapEntity *)0x0) {
          local_1e8 = 0;
        }
        else {
          local_1e8 = __dynamic_cast(pHVar7,&(anonymous_namespace)::HeapEntity::typeinfo,
                                     &(anonymous_namespace)::HeapArray::typeinfo,0);
        }
        if (local_1e8 == 0) {
          __assert_fail("dynamic_cast<HeapArray *>(curr)",
                        "/workspace/llm4binary/github/license_c_cmakelists/google[P]jsonnet/core/state.h"
                        ,0x18b,
                        "void jsonnet::internal::(anonymous namespace)::Heap::markFrom(HeapEntity *)"
                       );
        }
        local_100 = local_58;
        local_108 = local_58 + 1;
        local_110._M_current =
             (HeapThunk **)
             std::
             vector<jsonnet::internal::(anonymous_namespace)::HeapThunk_*,_std::allocator<jsonnet::internal::(anonymous_namespace)::HeapThunk_*>_>
             ::begin((vector<jsonnet::internal::(anonymous_namespace)::HeapThunk_*,_std::allocator<jsonnet::internal::(anonymous_namespace)::HeapThunk_*>_>
                      *)in_stack_fffffffffffffdd8);
        local_118 = (HeapThunk **)
                    std::
                    vector<jsonnet::internal::(anonymous_namespace)::HeapThunk_*,_std::allocator<jsonnet::internal::(anonymous_namespace)::HeapThunk_*>_>
                    ::end((vector<jsonnet::internal::(anonymous_namespace)::HeapThunk_*,_std::allocator<jsonnet::internal::(anonymous_namespace)::HeapThunk_*>_>
                           *)in_stack_fffffffffffffdd8);
        while (bVar2 = __gnu_cxx::operator!=
                                 ((__normal_iterator<jsonnet::internal::(anonymous_namespace)::HeapThunk_**,_std::vector<jsonnet::internal::(anonymous_namespace)::HeapThunk_*,_std::allocator<jsonnet::internal::(anonymous_namespace)::HeapThunk_*>_>_>
                                   *)in_stack_fffffffffffffde0,
                                  (__normal_iterator<jsonnet::internal::(anonymous_namespace)::HeapThunk_**,_std::vector<jsonnet::internal::(anonymous_namespace)::HeapThunk_*,_std::allocator<jsonnet::internal::(anonymous_namespace)::HeapThunk_*>_>_>
                                   *)in_stack_fffffffffffffdd8), bVar2) {
          ppHVar6 = __gnu_cxx::
                    __normal_iterator<jsonnet::internal::(anonymous_namespace)::HeapThunk_**,_std::vector<jsonnet::internal::(anonymous_namespace)::HeapThunk_*,_std::allocator<jsonnet::internal::(anonymous_namespace)::HeapThunk_*>_>_>
                    ::operator*(&local_110);
          local_120 = *ppHVar6;
          addIfHeapEntity(in_stack_fffffffffffffde0,in_stack_fffffffffffffdd8,
                          (vector<jsonnet::internal::(anonymous_namespace)::HeapEntity_*,_std::allocator<jsonnet::internal::(anonymous_namespace)::HeapEntity_*>_>
                           *)0x234439);
          __gnu_cxx::
          __normal_iterator<jsonnet::internal::(anonymous_namespace)::HeapThunk_**,_std::vector<jsonnet::internal::(anonymous_namespace)::HeapThunk_*,_std::allocator<jsonnet::internal::(anonymous_namespace)::HeapThunk_*>_>_>
          ::operator++(&local_110);
        }
        break;
      case CLOSURE:
        if (pHVar7 == (HeapEntity *)0x0) {
          local_1f8 = 0;
        }
        else {
          local_1f8 = __dynamic_cast(pHVar7,&(anonymous_namespace)::HeapEntity::typeinfo,
                                     &(anonymous_namespace)::HeapClosure::typeinfo,0);
        }
        if (local_1f8 == 0) {
          __assert_fail("dynamic_cast<HeapClosure *>(curr)",
                        "/workspace/llm4binary/github/license_c_cmakelists/google[P]jsonnet/core/state.h"
                        ,0x192,
                        "void jsonnet::internal::(anonymous namespace)::Heap::markFrom(HeapEntity *)"
                       );
        }
        local_128 = local_58;
        local_130 = local_58 + 1;
        local_138._M_node =
             (_Base_ptr)
             std::
             map<const_jsonnet::internal::Identifier_*,_jsonnet::internal::(anonymous_namespace)::HeapThunk_*,_std::less<const_jsonnet::internal::Identifier_*>,_std::allocator<std::pair<const_jsonnet::internal::Identifier_*const,_jsonnet::internal::(anonymous_namespace)::HeapThunk_*>_>_>
             ::begin((map<const_jsonnet::internal::Identifier_*,_jsonnet::internal::(anonymous_namespace)::HeapThunk_*,_std::less<const_jsonnet::internal::Identifier_*>,_std::allocator<std::pair<const_jsonnet::internal::Identifier_*const,_jsonnet::internal::(anonymous_namespace)::HeapThunk_*>_>_>
                      *)in_stack_fffffffffffffdd8);
        local_140._M_node =
             (_Base_ptr)
             std::
             map<const_jsonnet::internal::Identifier_*,_jsonnet::internal::(anonymous_namespace)::HeapThunk_*,_std::less<const_jsonnet::internal::Identifier_*>,_std::allocator<std::pair<const_jsonnet::internal::Identifier_*const,_jsonnet::internal::(anonymous_namespace)::HeapThunk_*>_>_>
             ::end((map<const_jsonnet::internal::Identifier_*,_jsonnet::internal::(anonymous_namespace)::HeapThunk_*,_std::less<const_jsonnet::internal::Identifier_*>,_std::allocator<std::pair<const_jsonnet::internal::Identifier_*const,_jsonnet::internal::(anonymous_namespace)::HeapThunk_*>_>_>
                    *)in_stack_fffffffffffffdd8);
        while (bVar2 = std::operator!=(&local_138,&local_140), bVar2) {
          ppVar4 = std::
                   _Rb_tree_const_iterator<std::pair<const_jsonnet::internal::Identifier_*const,_jsonnet::internal::(anonymous_namespace)::HeapThunk_*>_>
                   ::operator*((_Rb_tree_const_iterator<std::pair<const_jsonnet::internal::Identifier_*const,_jsonnet::internal::(anonymous_namespace)::HeapThunk_*>_>
                                *)in_stack_fffffffffffffde0);
          local_158 = ppVar4->first;
          pHStack_150 = ppVar4->second;
          addIfHeapEntity(in_stack_fffffffffffffde0,in_stack_fffffffffffffdd8,
                          (vector<jsonnet::internal::(anonymous_namespace)::HeapEntity_*,_std::allocator<jsonnet::internal::(anonymous_namespace)::HeapEntity_*>_>
                           *)0x23455e);
          std::
          _Rb_tree_const_iterator<std::pair<const_jsonnet::internal::Identifier_*const,_jsonnet::internal::(anonymous_namespace)::HeapThunk_*>_>
          ::operator++((_Rb_tree_const_iterator<std::pair<const_jsonnet::internal::Identifier_*const,_jsonnet::internal::(anonymous_namespace)::HeapThunk_*>_>
                        *)in_stack_fffffffffffffde0);
        }
        if (local_128[4]._vptr_HeapEntity != (_func_int **)0x0) {
          addIfHeapEntity(in_stack_fffffffffffffde0,in_stack_fffffffffffffdd8,
                          (vector<jsonnet::internal::(anonymous_namespace)::HeapEntity_*,_std::allocator<jsonnet::internal::(anonymous_namespace)::HeapEntity_*>_>
                           *)0x2345a5);
        }
        break;
      case STRING:
        if (pHVar7 == (HeapEntity *)0x0) {
          in_stack_fffffffffffffde8 = (HeapEntity **)0x0;
        }
        else {
          in_stack_fffffffffffffde8 =
               (HeapEntity **)
               __dynamic_cast(pHVar7,&(anonymous_namespace)::HeapEntity::typeinfo,
                              &(anonymous_namespace)::HeapString::typeinfo,0);
        }
        in_stack_fffffffffffffdf0 = pHVar7;
        if (in_stack_fffffffffffffde8 == (HeapEntity **)0x0) {
          __assert_fail("dynamic_cast<HeapString *>(curr)",
                        "/workspace/llm4binary/github/license_c_cmakelists/google[P]jsonnet/core/state.h"
                        ,0x1a9,
                        "void jsonnet::internal::(anonymous namespace)::Heap::markFrom(HeapEntity *)"
                       );
        }
        break;
      case SIMPLE_OBJECT:
        if (pHVar7 == (HeapEntity *)0x0) {
          local_1b8 = 0;
        }
        else {
          local_1b8 = __dynamic_cast(pHVar7,&(anonymous_namespace)::HeapEntity::typeinfo,
                                     &(anonymous_namespace)::HeapSimpleObject::typeinfo,0);
        }
        if (local_1b8 == 0) {
          __assert_fail("dynamic_cast<HeapSimpleObject *>(curr)",
                        "/workspace/llm4binary/github/license_c_cmakelists/google[P]jsonnet/core/state.h"
                        ,0x174,
                        "void jsonnet::internal::(anonymous namespace)::Heap::markFrom(HeapEntity *)"
                       );
        }
        local_60 = local_58;
        local_68 = local_58 + 1;
        local_70._M_node =
             (_Base_ptr)
             std::
             map<const_jsonnet::internal::Identifier_*,_jsonnet::internal::(anonymous_namespace)::HeapThunk_*,_std::less<const_jsonnet::internal::Identifier_*>,_std::allocator<std::pair<const_jsonnet::internal::Identifier_*const,_jsonnet::internal::(anonymous_namespace)::HeapThunk_*>_>_>
             ::begin((map<const_jsonnet::internal::Identifier_*,_jsonnet::internal::(anonymous_namespace)::HeapThunk_*,_std::less<const_jsonnet::internal::Identifier_*>,_std::allocator<std::pair<const_jsonnet::internal::Identifier_*const,_jsonnet::internal::(anonymous_namespace)::HeapThunk_*>_>_>
                      *)in_stack_fffffffffffffdd8);
        local_78._M_node =
             (_Base_ptr)
             std::
             map<const_jsonnet::internal::Identifier_*,_jsonnet::internal::(anonymous_namespace)::HeapThunk_*,_std::less<const_jsonnet::internal::Identifier_*>,_std::allocator<std::pair<const_jsonnet::internal::Identifier_*const,_jsonnet::internal::(anonymous_namespace)::HeapThunk_*>_>_>
             ::end((map<const_jsonnet::internal::Identifier_*,_jsonnet::internal::(anonymous_namespace)::HeapThunk_*,_std::less<const_jsonnet::internal::Identifier_*>,_std::allocator<std::pair<const_jsonnet::internal::Identifier_*const,_jsonnet::internal::(anonymous_namespace)::HeapThunk_*>_>_>
                    *)in_stack_fffffffffffffdd8);
        while (bVar2 = std::operator!=(&local_70,&local_78), bVar2) {
          ppVar4 = std::
                   _Rb_tree_const_iterator<std::pair<const_jsonnet::internal::Identifier_*const,_jsonnet::internal::(anonymous_namespace)::HeapThunk_*>_>
                   ::operator*((_Rb_tree_const_iterator<std::pair<const_jsonnet::internal::Identifier_*const,_jsonnet::internal::(anonymous_namespace)::HeapThunk_*>_>
                                *)in_stack_fffffffffffffde0);
          local_88 = ppVar4->first;
          pHStack_80 = ppVar4->second;
          addIfHeapEntity(in_stack_fffffffffffffde0,in_stack_fffffffffffffdd8,
                          (vector<jsonnet::internal::(anonymous_namespace)::HeapEntity_*,_std::allocator<jsonnet::internal::(anonymous_namespace)::HeapEntity_*>_>
                           *)0x23407c);
          std::
          _Rb_tree_const_iterator<std::pair<const_jsonnet::internal::Identifier_*const,_jsonnet::internal::(anonymous_namespace)::HeapThunk_*>_>
          ::operator++((_Rb_tree_const_iterator<std::pair<const_jsonnet::internal::Identifier_*const,_jsonnet::internal::(anonymous_namespace)::HeapThunk_*>_>
                        *)in_stack_fffffffffffffde0);
        }
        break;
      case COMPREHENSION_OBJECT:
        if (pHVar7 == (HeapEntity *)0x0) {
          local_1d8 = 0;
        }
        else {
          local_1d8 = __dynamic_cast(pHVar7,&(anonymous_namespace)::HeapEntity::typeinfo,
                                     &(anonymous_namespace)::HeapComprehensionObject::typeinfo,0);
        }
        if (local_1d8 == 0) {
          __assert_fail("dynamic_cast<HeapComprehensionObject *>(curr)",
                        "/workspace/llm4binary/github/license_c_cmakelists/google[P]jsonnet/core/state.h"
                        ,0x182,
                        "void jsonnet::internal::(anonymous namespace)::Heap::markFrom(HeapEntity *)"
                       );
        }
        local_98 = local_58;
        local_a0 = local_58 + 1;
        local_a8._M_node =
             (_Base_ptr)
             std::
             map<const_jsonnet::internal::Identifier_*,_jsonnet::internal::(anonymous_namespace)::HeapThunk_*,_std::less<const_jsonnet::internal::Identifier_*>,_std::allocator<std::pair<const_jsonnet::internal::Identifier_*const,_jsonnet::internal::(anonymous_namespace)::HeapThunk_*>_>_>
             ::begin((map<const_jsonnet::internal::Identifier_*,_jsonnet::internal::(anonymous_namespace)::HeapThunk_*,_std::less<const_jsonnet::internal::Identifier_*>,_std::allocator<std::pair<const_jsonnet::internal::Identifier_*const,_jsonnet::internal::(anonymous_namespace)::HeapThunk_*>_>_>
                      *)in_stack_fffffffffffffdd8);
        local_b0._M_node =
             (_Base_ptr)
             std::
             map<const_jsonnet::internal::Identifier_*,_jsonnet::internal::(anonymous_namespace)::HeapThunk_*,_std::less<const_jsonnet::internal::Identifier_*>,_std::allocator<std::pair<const_jsonnet::internal::Identifier_*const,_jsonnet::internal::(anonymous_namespace)::HeapThunk_*>_>_>
             ::end((map<const_jsonnet::internal::Identifier_*,_jsonnet::internal::(anonymous_namespace)::HeapThunk_*,_std::less<const_jsonnet::internal::Identifier_*>,_std::allocator<std::pair<const_jsonnet::internal::Identifier_*const,_jsonnet::internal::(anonymous_namespace)::HeapThunk_*>_>_>
                    *)in_stack_fffffffffffffdd8);
        while (bVar2 = std::operator!=(&local_a8,&local_b0), bVar2) {
          ppVar4 = std::
                   _Rb_tree_const_iterator<std::pair<const_jsonnet::internal::Identifier_*const,_jsonnet::internal::(anonymous_namespace)::HeapThunk_*>_>
                   ::operator*((_Rb_tree_const_iterator<std::pair<const_jsonnet::internal::Identifier_*const,_jsonnet::internal::(anonymous_namespace)::HeapThunk_*>_>
                                *)in_stack_fffffffffffffde0);
          local_c8 = ppVar4->first;
          pHStack_c0 = ppVar4->second;
          addIfHeapEntity(in_stack_fffffffffffffde0,in_stack_fffffffffffffdd8,
                          (vector<jsonnet::internal::(anonymous_namespace)::HeapEntity_*,_std::allocator<jsonnet::internal::(anonymous_namespace)::HeapEntity_*>_>
                           *)0x23426f);
          std::
          _Rb_tree_const_iterator<std::pair<const_jsonnet::internal::Identifier_*const,_jsonnet::internal::(anonymous_namespace)::HeapThunk_*>_>
          ::operator++((_Rb_tree_const_iterator<std::pair<const_jsonnet::internal::Identifier_*const,_jsonnet::internal::(anonymous_namespace)::HeapThunk_*>_>
                        *)in_stack_fffffffffffffde0);
        }
        local_d0 = local_98 + 5;
        local_d8._M_node =
             (_Base_ptr)
             std::
             map<const_jsonnet::internal::Identifier_*,_jsonnet::internal::(anonymous_namespace)::HeapThunk_*,_std::less<const_jsonnet::internal::Identifier_*>,_std::allocator<std::pair<const_jsonnet::internal::Identifier_*const,_jsonnet::internal::(anonymous_namespace)::HeapThunk_*>_>_>
             ::begin((map<const_jsonnet::internal::Identifier_*,_jsonnet::internal::(anonymous_namespace)::HeapThunk_*,_std::less<const_jsonnet::internal::Identifier_*>,_std::allocator<std::pair<const_jsonnet::internal::Identifier_*const,_jsonnet::internal::(anonymous_namespace)::HeapThunk_*>_>_>
                      *)in_stack_fffffffffffffdd8);
        local_e0._M_node =
             (_Base_ptr)
             std::
             map<const_jsonnet::internal::Identifier_*,_jsonnet::internal::(anonymous_namespace)::HeapThunk_*,_std::less<const_jsonnet::internal::Identifier_*>,_std::allocator<std::pair<const_jsonnet::internal::Identifier_*const,_jsonnet::internal::(anonymous_namespace)::HeapThunk_*>_>_>
             ::end((map<const_jsonnet::internal::Identifier_*,_jsonnet::internal::(anonymous_namespace)::HeapThunk_*,_std::less<const_jsonnet::internal::Identifier_*>,_std::allocator<std::pair<const_jsonnet::internal::Identifier_*const,_jsonnet::internal::(anonymous_namespace)::HeapThunk_*>_>_>
                    *)in_stack_fffffffffffffdd8);
        while (bVar2 = std::operator!=(&local_d8,&local_e0), bVar2) {
          ppVar5 = std::
                   _Rb_tree_iterator<std::pair<const_jsonnet::internal::Identifier_*const,_jsonnet::internal::(anonymous_namespace)::HeapThunk_*>_>
                   ::operator*((_Rb_tree_iterator<std::pair<const_jsonnet::internal::Identifier_*const,_jsonnet::internal::(anonymous_namespace)::HeapThunk_*>_>
                                *)0x2342e8);
          local_f8 = ppVar5->first;
          pHStack_f0 = ppVar5->second;
          addIfHeapEntity(in_stack_fffffffffffffde0,in_stack_fffffffffffffdd8,
                          (vector<jsonnet::internal::(anonymous_namespace)::HeapEntity_*,_std::allocator<jsonnet::internal::(anonymous_namespace)::HeapEntity_*>_>
                           *)0x234314);
          std::
          _Rb_tree_iterator<std::pair<const_jsonnet::internal::Identifier_*const,_jsonnet::internal::(anonymous_namespace)::HeapThunk_*>_>
          ::operator++((_Rb_tree_iterator<std::pair<const_jsonnet::internal::Identifier_*const,_jsonnet::internal::(anonymous_namespace)::HeapThunk_*>_>
                        *)in_stack_fffffffffffffde0);
        }
        break;
      case EXTENDED_OBJECT:
        if (pHVar7 == (HeapEntity *)0x0) {
          local_1c8 = 0;
        }
        else {
          local_1c8 = __dynamic_cast(pHVar7,&(anonymous_namespace)::HeapEntity::typeinfo,
                                     &(anonymous_namespace)::HeapExtendedObject::typeinfo,0);
        }
        if (local_1c8 == 0) {
          __assert_fail("dynamic_cast<HeapExtendedObject *>(curr)",
                        "/workspace/llm4binary/github/license_c_cmakelists/google[P]jsonnet/core/state.h"
                        ,0x17b,
                        "void jsonnet::internal::(anonymous namespace)::Heap::markFrom(HeapEntity *)"
                       );
        }
        local_90 = local_58;
        addIfHeapEntity(in_stack_fffffffffffffde0,in_stack_fffffffffffffdd8,
                        (vector<jsonnet::internal::(anonymous_namespace)::HeapEntity_*,_std::allocator<jsonnet::internal::(anonymous_namespace)::HeapEntity_*>_>
                         *)0x234134);
        addIfHeapEntity(in_stack_fffffffffffffde0,in_stack_fffffffffffffdd8,
                        (vector<jsonnet::internal::(anonymous_namespace)::HeapEntity_*,_std::allocator<jsonnet::internal::(anonymous_namespace)::HeapEntity_*>_>
                         *)0x23415b);
        break;
      default:
        __assert_fail("false",
                      "/workspace/llm4binary/github/license_c_cmakelists/google[P]jsonnet/core/state.h"
                      ,0x1ac,
                      "void jsonnet::internal::(anonymous namespace)::Heap::markFrom(HeapEntity *)")
        ;
      }
    }
    sVar3 = std::
            vector<jsonnet::internal::(anonymous_namespace)::HeapEntity_*,_std::allocator<jsonnet::internal::(anonymous_namespace)::HeapEntity_*>_>
            ::size(&local_50->children);
    if (sVar3 == 0) {
      std::vector<State,_std::allocator<State>_>::pop_back
                ((vector<State,_std::allocator<State>_> *)0x23486d);
    }
    else {
      in_stack_fffffffffffffde0 = (Heap *)&local_50->children;
      sVar3 = std::
              vector<jsonnet::internal::(anonymous_namespace)::HeapEntity_*,_std::allocator<jsonnet::internal::(anonymous_namespace)::HeapEntity_*>_>
              ::size((vector<jsonnet::internal::(anonymous_namespace)::HeapEntity_*,_std::allocator<jsonnet::internal::(anonymous_namespace)::HeapEntity_*>_>
                      *)in_stack_fffffffffffffde0);
      std::
      vector<jsonnet::internal::(anonymous_namespace)::HeapEntity_*,_std::allocator<jsonnet::internal::(anonymous_namespace)::HeapEntity_*>_>
      ::operator[]((vector<jsonnet::internal::(anonymous_namespace)::HeapEntity_*,_std::allocator<jsonnet::internal::(anonymous_namespace)::HeapEntity_*>_>
                    *)in_stack_fffffffffffffde0,sVar3 - 1);
      std::
      vector<jsonnet::internal::(anonymous_namespace)::HeapEntity_*,_std::allocator<jsonnet::internal::(anonymous_namespace)::HeapEntity_*>_>
      ::pop_back((vector<jsonnet::internal::(anonymous_namespace)::HeapEntity_*,_std::allocator<jsonnet::internal::(anonymous_namespace)::HeapEntity_*>_>
                  *)0x234847);
      std::
      vector<jsonnet::internal::(anonymous_namespace)::Heap::markFrom(jsonnet::internal::(anonymous_namespace)::HeapEntity*)::State,std::allocator<jsonnet::internal::(anonymous_namespace)::Heap::markFrom(jsonnet::internal::(anonymous_namespace)::HeapEntity*)::State>>
      ::emplace_back<jsonnet::internal::(anonymous_namespace)::HeapEntity*&>
                ((vector<State,_std::allocator<State>_> *)in_stack_fffffffffffffdf0,
                 in_stack_fffffffffffffde8);
    }
  } while( true );
}

Assistant:

void markFrom(HeapEntity *from)
    {
        assert(from != nullptr);
        const GarbageCollectionMark thisMark = lastMark + 1;
        struct State {
            HeapEntity *ent;
            std::vector<HeapEntity *> children;
            State(HeapEntity *ent) : ent(ent) {}
        };

        std::vector<State> stack;
        stack.emplace_back(from);

        while (stack.size() > 0) {
            size_t curr_index = stack.size() - 1;
            State &s = stack[curr_index];
            HeapEntity *curr = s.ent;
            if (curr->mark != thisMark) {
                curr->mark = thisMark;

                switch(curr->type) {
                    case HeapEntity::SIMPLE_OBJECT: {
                        assert(dynamic_cast<HeapSimpleObject *>(curr));
                        auto *obj = static_cast<HeapSimpleObject *>(curr);
                        for (auto upv : obj->upValues)
                            addIfHeapEntity(upv.second, s.children);
                        break;
                    }
                    case HeapEntity::EXTENDED_OBJECT: {
                        assert(dynamic_cast<HeapExtendedObject *>(curr));
                        auto *obj = static_cast<HeapExtendedObject *>(curr);
                        addIfHeapEntity(obj->left, s.children);
                        addIfHeapEntity(obj->right, s.children);
                        break;
                    }
                    case HeapEntity::COMPREHENSION_OBJECT: {
                        assert(dynamic_cast<HeapComprehensionObject *>(curr));
                        auto *obj = static_cast<HeapComprehensionObject *>(curr);
                        for (auto upv : obj->upValues)
                            addIfHeapEntity(upv.second, s.children);
                        for (auto upv : obj->compValues)
                            addIfHeapEntity(upv.second, s.children);
                        break;
                    }
                    case HeapEntity::ARRAY: {
                        assert(dynamic_cast<HeapArray *>(curr));
                        auto *arr = static_cast<HeapArray *>(curr);
                        for (auto el : arr->elements)
                            addIfHeapEntity(el, s.children);
                        break;
                    }
                    case HeapEntity::CLOSURE: {
                        assert(dynamic_cast<HeapClosure *>(curr));
                        auto *func = static_cast<HeapClosure *>(curr);
                        for (auto upv : func->upValues)
                            addIfHeapEntity(upv.second, s.children);
                        if (func->self)
                            addIfHeapEntity(func->self, s.children);
                        break;
                    }
                    case HeapEntity::THUNK: {
                        assert(dynamic_cast<HeapThunk *>(curr));
                        auto *thunk = static_cast<HeapThunk *>(curr);
                        if (thunk->filled) {
                            if (thunk->content.isHeap())
                                addIfHeapEntity(thunk->content.v.h, s.children);
                        } else {
                            for (auto upv : thunk->upValues)
                                addIfHeapEntity(upv.second, s.children);
                            if (thunk->self)
                                addIfHeapEntity(thunk->self, s.children);
                        }
                        break;
                    }
                    case HeapEntity::STRING:
                        assert(dynamic_cast<HeapString *>(curr));
                        break;
                    default:
                        assert(false);
                        break;
                }
            }

            if (s.children.size() > 0) {
                HeapEntity *next = s.children[s.children.size() - 1];
                s.children.pop_back();
                stack.emplace_back(next);  // CAUTION: s invalidated here
            } else {
                stack.pop_back();  // CAUTION: s invalidated here
            }
        }
    }